

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# base32.h
# Opt level: O0

int base32_encode(uint8_t *data,int length,uint8_t *result,int bufSize)

{
  char cVar1;
  bool local_3e;
  int index;
  int pad;
  int bitsLeft;
  int next;
  int buffer;
  int count;
  int bufSize_local;
  uint8_t *result_local;
  int length_local;
  uint8_t *data_local;
  int local_4;
  
  if ((length < 0) || (0x10000000 < length)) {
    local_4 = -1;
  }
  else {
    count = 0;
    if (0 < length) {
      buffer = (int)*data;
      next = 1;
      bitsLeft = 8;
      while( true ) {
        local_3e = false;
        if (count < bufSize) {
          local_3e = 0 < bitsLeft || next < length;
        }
        if (!local_3e) break;
        if (bitsLeft < 5) {
          if (next < length) {
            buffer = (uint)data[next] | buffer << 8;
            bitsLeft = bitsLeft + 8;
            next = next + 1;
          }
          else {
            buffer = buffer << ((byte)(5 - bitsLeft) & 0x1f);
            bitsLeft = (5 - bitsLeft) + bitsLeft;
          }
        }
        cVar1 = (char)bitsLeft;
        bitsLeft = bitsLeft + -5;
        result[count] =
             "ABCDEFGHIJKLMNOPQRSTUVWXYZ234567"[(int)(buffer >> (cVar1 - 5U & 0x1f) & 0x1f)];
        count = count + 1;
      }
    }
    if (count < bufSize) {
      result[count] = '\0';
    }
    local_4 = count;
  }
  return local_4;
}

Assistant:

int base32_encode(const uint8_t *data, int length, uint8_t *result, int bufSize) {
  if (length < 0 || length > (1 << 28)) {
    return -1;
  }
  int count = 0;
  if (length > 0) {
    int buffer = data[0];
    int next = 1;
    int bitsLeft = 8;
    while (count < bufSize && (bitsLeft > 0 || next < length)) {
      if (bitsLeft < 5) {
        if (next < length) {
          buffer <<= 8;
          buffer |= data[next++] & 0xFF;
          bitsLeft += 8;
        } else {
          int pad = 5 - bitsLeft;
          buffer <<= pad;
          bitsLeft += pad;
        }
      }
      int index = 0x1F & (buffer >> (bitsLeft - 5));
      bitsLeft -= 5;
      result[count++] = "ABCDEFGHIJKLMNOPQRSTUVWXYZ234567"[index];
    }
  }
  if (count < bufSize) {
    result[count] = '\000';
  }
  return count;
}